

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int JsUtil::
    BaseDictionary<unsigned_long,_const_TTD::NSSnapValues::SlotArrayInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::GetNextFreeEntryIndex(EntryType *freeEntry)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (-2 < (freeEntry->
           super_DefaultHashedEntry<unsigned_long,_const_TTD::NSSnapValues::SlotArrayInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
           ).super_KeyValueEntry<unsigned_long,_const_TTD::NSSnapValues::SlotArrayInfo_*>.
           super_ValueEntry<const_TTD::NSSnapValues::SlotArrayInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_const_TTD::NSSnapValues::SlotArrayInfo_*>_>
           .super_KeyValueEntryDataLayout2<unsigned_long,_const_TTD::NSSnapValues::SlotArrayInfo_*>.
           next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x32a,"(IsFreeEntry(freeEntry))","IsFreeEntry(freeEntry)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return -2 - (freeEntry->
              super_DefaultHashedEntry<unsigned_long,_const_TTD::NSSnapValues::SlotArrayInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              ).super_KeyValueEntry<unsigned_long,_const_TTD::NSSnapValues::SlotArrayInfo_*>.
              super_ValueEntry<const_TTD::NSSnapValues::SlotArrayInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_const_TTD::NSSnapValues::SlotArrayInfo_*>_>
              .
              super_KeyValueEntryDataLayout2<unsigned_long,_const_TTD::NSSnapValues::SlotArrayInfo_*>
              .next;
}

Assistant:

static int GetNextFreeEntryIndex(const EntryType &freeEntry)
        {
            Assert(IsFreeEntry(freeEntry));
            return FreeListSentinel - freeEntry.next;
        }